

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

StringPtr * __thiscall
kj::Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_>::insert
          (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *this,
          StringPtr *row)

{
  uint uVar1;
  undefined4 *puVar2;
  StringPtr *pSVar3;
  size_t newSize;
  long lVar4;
  ulong uVar5;
  Iterator iter;
  int local_74;
  Iterator local_70;
  long local_58;
  long local_50;
  SearchKey local_48;
  Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *local_40;
  long *local_38;
  int *local_30;
  
  local_58 = *(long *)this;
  lVar4 = *(long *)(this + 8) - local_58 >> 2;
  local_40 = this + 0x20;
  local_74 = *(int *)&(row->content).ptr;
  local_30 = &local_74;
  local_38 = &local_58;
  local_48._vptr_SearchKey = (_func_int **)&PTR_search_001c0c08;
  local_50 = lVar4;
  _::BTreeImpl::insert(&local_70,(BTreeImpl *)(this + 0x28),&local_48);
  uVar5 = (ulong)local_70.row;
  if (((uVar5 != 0xe) && (uVar1 = (local_70.leaf)->rows[uVar5].i, uVar1 != 0)) &&
     (*(int *)(local_58 + (ulong)(uVar1 - 1) * 4) == local_74)) {
    _::throwDuplicateTableRow();
  }
  memmove((local_70.leaf)->rows + uVar5 + 1,(local_70.leaf)->rows + uVar5,
          (ulong)(local_70.row + 1) * -4 + 0x38);
  (local_70.leaf)->rows[uVar5].i = (int)lVar4 + 1;
  lVar4 = *(long *)(this + 0x10);
  if (*(long *)(this + 8) == lVar4) {
    newSize = 4;
    if (lVar4 != *(long *)this) {
      newSize = lVar4 - *(long *)this >> 1;
    }
    Vector<unsigned_int>::setCapacity((Vector<unsigned_int> *)this,newSize);
  }
  puVar2 = *(undefined4 **)(this + 8);
  *puVar2 = *(undefined4 *)&(row->content).ptr;
  pSVar3 = (StringPtr *)(puVar2 + 1);
  *(StringPtr **)(this + 8) = pSVar3;
  return pSVar3;
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }